

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

void dgrminer::printOutEdges
               (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *edge_list)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"PRINTING EDGE LIST - START");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(edge_list->
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(edge_list->
                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          *(int *)((long)((edge_list->
                                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                  lVar2 * 4 + lVar3));
      std::operator<<(poVar1,", ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar3 = lVar3 + 0x20;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"PRINTING EDGE LIST - START");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printOutEdges(std::vector<std::array<int, 8>> &edge_list)
    {
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
        for (size_t i = 0; i < edge_list.size(); i++)
        {

            for (int j = 0; j < 8; j++)
            {
                std::cout << edge_list[i][j] << ", ";
            }
            std::cout << std::endl;
        }
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
    }